

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

connectbundle * Curl_conncache_find_bundle(connectdata *conn,conncache *connc)

{
  size_t key_len;
  char local_a8 [8];
  char key [128];
  connectbundle *local_20;
  connectbundle *bundle;
  conncache *connc_local;
  connectdata *conn_local;
  
  local_20 = (connectbundle *)0x0;
  if (connc != (conncache *)0x0) {
    hashkey(conn,local_a8,0x80);
    key_len = strlen(local_a8);
    local_20 = (connectbundle *)Curl_hash_pick(&connc->hash,local_a8,key_len);
  }
  return local_20;
}

Assistant:

struct connectbundle *Curl_conncache_find_bundle(struct connectdata *conn,
                                                 struct conncache *connc)
{
  struct connectbundle *bundle = NULL;
  if(connc) {
    char key[128];
    hashkey(conn, key, sizeof(key));
    bundle = Curl_hash_pick(&connc->hash, key, strlen(key));
  }

  return bundle;
}